

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlcachedresult.cpp
# Opt level: O2

bool __thiscall QSqlCachedResult::fetch(QSqlCachedResult *this,int i)

{
  QSqlResultPrivate *this_00;
  _func_int *p_Var1;
  long lVar2;
  bool bVar3;
  int iVar4;
  
  this_00 = (this->super_QSqlResult).d_ptr;
  bVar3 = QSqlResult::isActive(&this->super_QSqlResult);
  if (i < 0 || !bVar3) {
    return false;
  }
  iVar4 = QSqlResult::at(&this->super_QSqlResult);
  if (iVar4 == i) {
    return true;
  }
  if (this_00->forwardOnly == true) {
    iVar4 = QSqlResult::at(&this->super_QSqlResult);
    if (i < iVar4) {
      return false;
    }
    iVar4 = QSqlResult::at(&this->super_QSqlResult);
    if (iVar4 == -2) {
      return false;
    }
    while( true ) {
      iVar4 = QSqlResult::at(&this->super_QSqlResult);
      p_Var1 = (this->super_QSqlResult)._vptr_QSqlResult[0x1f];
      if (i + -1 <= iVar4) break;
      iVar4 = (*p_Var1)(this,this_00 + 1,0xffffffff);
      if ((char)iVar4 == '\0') {
        return false;
      }
      iVar4 = QSqlResult::at(&this->super_QSqlResult);
      (*(this->super_QSqlResult)._vptr_QSqlResult[3])(this,(ulong)(iVar4 + 1));
    }
    iVar4 = (*p_Var1)(this,this_00 + 1,0);
    if ((char)iVar4 == '\0') {
      return false;
    }
    iVar4 = QSqlResult::at(&this->super_QSqlResult);
    i = iVar4 + 1;
  }
  else {
    bVar3 = QSqlCachedResultPrivate::canSeek((QSqlCachedResultPrivate *)this_00,i);
    if (!bVar3) {
      iVar4 = *(int *)&this_00[1].sqldriver.wp.value;
      if (0 < iVar4) {
        lVar2 = (long)*(int *)((long)&this_00[1].sqldriver.wp.value + 4);
        (*(this->super_QSqlResult)._vptr_QSqlResult[3])
                  (this,(long)iVar4 / lVar2 & 0xffffffff,(long)iVar4 % lVar2 & 0xffffffff);
      }
      do {
        iVar4 = QSqlResult::at(&this->super_QSqlResult);
        if (i < iVar4) goto LAB_0011773a;
        bVar3 = cacheNext(this);
      } while (bVar3);
      bVar3 = QSqlCachedResultPrivate::canSeek((QSqlCachedResultPrivate *)this_00,i);
      if (!bVar3) {
        return false;
      }
    }
  }
LAB_0011773a:
  (*(this->super_QSqlResult)._vptr_QSqlResult[3])(this,(ulong)(uint)i);
  return true;
}

Assistant:

bool QSqlCachedResult::fetch(int i)
{
    Q_D(QSqlCachedResult);
    if ((!isActive()) || (i < 0))
        return false;
    if (at() == i)
        return true;
    if (d->forwardOnly) {
        // speed hack - do not copy values if not needed
        if (at() > i || at() == QSql::AfterLastRow)
            return false;
        while(at() < i - 1) {
            if (!gotoNext(d->cache, -1))
                return false;
            setAt(at() + 1);
        }
        if (!gotoNext(d->cache, 0))
            return false;
        setAt(at() + 1);
        return true;
    }
    if (d->canSeek(i)) {
        setAt(i);
        return true;
    }
    if (d->rowCacheEnd > 0)
        setAt(d->cacheCount());
    while (at() < i + 1) {
        if (!cacheNext()) {
            if (d->canSeek(i))
                break;
            return false;
        }
    }
    setAt(i);

    return true;
}